

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  uint _c;
  undefined4 uVar24;
  _func_int *p_Var25;
  uint uVar26;
  int *piVar27;
  int iVar28;
  Layer *pLVar29;
  int iVar30;
  undefined8 *puVar31;
  int i_1;
  undefined4 *puVar32;
  ulong uVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int _h;
  int iVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  int iVar43;
  Mat *pMVar44;
  ulong uVar45;
  float fVar46;
  float fVar47;
  undefined8 uStack_940;
  ParamDict pd;
  
  switch(*(undefined4 *)(&this->field_0xbc + (long)this->_vptr_Convolution_x86[-3])) {
  case 1:
    pLVar29 = create_layer(0x1a);
    this->activation = pLVar29;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 2:
    pLVar29 = create_layer(0x1a);
    this->activation = pLVar29;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0xc0 + (long)this->_vptr_Convolution_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 3:
    pLVar29 = create_layer(0x36);
    this->activation = pLVar29;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0xc0 + (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0xc0 +
                                             (long)this->_vptr_Convolution_x86[-3]) + 4));
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 4:
    pLVar29 = create_layer(0x1e);
    this->activation = pLVar29;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  default:
    goto switchD_00126860_default;
  }
  ParamDict::~ParamDict(&pd);
switchD_00126860_default:
  pLVar29 = this->activation;
  if (pLVar29 != (Layer *)0x0) {
    (*pLVar29->_vptr_Layer[4])(pLVar29,opt);
  }
  this->use_winograd3x3 = false;
  if ((((((opt->use_winograd_convolution == true) &&
         (p_Var25 = this->_vptr_Convolution_x86[-3],
         *(int *)(p_Var25 + 0x2c + (long)&(this->weight_sgemm_data).data) == 3)) &&
        (*(int *)(p_Var25 + 0x30 + (long)&(this->weight_sgemm_data).data) == 3)) &&
       ((*(int *)(p_Var25 + 0x34 + (long)&(this->weight_sgemm_data).data) == 1 &&
        (*(int *)(p_Var25 + 0x38 + (long)&(this->weight_sgemm_data).data) == 1)))) &&
      ((*(int *)(p_Var25 + 0x3c + (long)&(this->weight_sgemm_data).data) == 1 &&
       ((*(int *)(p_Var25 +
                 (long)&(this->weight_3x3_winograd43_data).
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>) == 1 &&
        (uVar45 = (long)*(int *)(&this->field_0xb4 + (long)p_Var25) / 9,
        0xf < *(int *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data))))))) &&
     (0xf < (int)((long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
                 (long)*(int *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data)))) {
    this->use_winograd3x3 = true;
    p_Var25 = this->_vptr_Convolution_x86[-3];
    _c = *(uint *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data);
    uVar45 = (long)*(int *)(&this->field_0xb4 + (long)p_Var25) / 9;
    uVar45 = (long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
             (long)(int)_c;
    pMVar44 = &this->weight_3x3_winograd23_data;
    iVar40 = (int)uVar45;
    uVar45 = uVar45 & 0xffffffff;
    if (iVar40 < 1) {
      uVar45 = 0;
    }
    uVar26 = 0;
    if (0 < (int)_c) {
      uVar26 = _c;
    }
    if ((&this->field_0x1c8)[(long)p_Var25] == '\x01') {
      Mat::create(pMVar44,0x24,iVar40,_c,2,(Allocator *)0x0);
      for (uVar33 = 0; uVar33 != uVar26; uVar33 = uVar33 + 1) {
        for (uVar42 = 0; uVar42 != uVar45; uVar42 = uVar42 + 1) {
          lVar36 = *(long *)(&this->field_0x100 + (long)p_Var25) + (long)(iVar40 * 9 * (int)uVar33);
          lVar37 = uVar42 * 9;
          Mat::channel((Mat *)&pd,pMVar44,(int)uVar33);
          iVar43 = pd.params[0].v.allocator._4_4_;
          piVar27 = pd.params[0].v.refcount;
          uVar11 = pd.params[0]._0_8_;
          Mat::~Mat((Mat *)&pd);
          cVar12 = *(char *)(lVar36 + lVar37);
          cVar13 = *(char *)(lVar36 + 1 + lVar37);
          cVar14 = *(char *)(lVar36 + 2 + lVar37);
          cVar15 = *(char *)(lVar36 + 3 + lVar37);
          cVar16 = *(char *)(lVar36 + 4 + lVar37);
          cVar17 = *(char *)(lVar36 + 5 + lVar37);
          cVar18 = *(char *)(lVar36 + 6 + lVar37);
          cVar19 = *(char *)(lVar36 + 7 + lVar37);
          cVar20 = *(char *)(lVar36 + 8 + lVar37);
          for (lVar37 = 4; lVar37 != 0x28; lVar37 = lVar37 + 6) {
            sVar21 = *(short *)(&UNK_00163b4c + lVar37);
            sVar22 = *(short *)(&UNK_00163b4e + lVar37);
            sVar23 = *(short *)((long)&DAT_00163b50 + lVar37);
            *(short *)((long)pd.params + lVar37 + -4) =
                 sVar23 * cVar14 + sVar22 * cVar13 + sVar21 * cVar12;
            *(short *)((long)pd.params + lVar37 + -2) =
                 sVar23 * cVar17 + sVar22 * cVar16 + sVar21 * cVar15;
            *(short *)((long)&pd.params[0].type + lVar37) =
                 sVar23 * cVar20 + sVar22 * cVar19 + sVar21 * cVar18;
          }
          lVar36 = uVar11 + (long)piVar27 * (long)(iVar43 * (int)uVar42);
          for (lVar37 = 0; lVar37 != 6; lVar37 = lVar37 + 1) {
            sVar21 = *(short *)((long)&pd.params[0].type + lVar37 * 6);
            uVar24 = *(undefined4 *)((long)&pd.params[0].type + lVar37 * 6 + 2);
            puVar32 = &DAT_00163b52;
            for (lVar39 = 0; lVar39 != 6; lVar39 = lVar39 + 1) {
              *(short *)(lVar36 + lVar39 * 2) =
                   (short)((uint)*puVar32 >> 0x10) * (short)((uint)uVar24 >> 0x10) +
                   (short)*puVar32 * (short)uVar24 + *(short *)((long)puVar32 + -2) * sVar21;
              puVar32 = (undefined4 *)((long)puVar32 + 6);
            }
            lVar36 = lVar36 + 0xc;
          }
        }
      }
    }
    else {
      Mat::create(pMVar44,0x10,iVar40,_c,4,(Allocator *)0x0);
      for (uVar33 = 0; uVar33 != uVar26; uVar33 = uVar33 + 1) {
        for (uVar42 = 0; uVar42 != uVar45; uVar42 = uVar42 + 1) {
          lVar37 = *(long *)(&this->field_0x100 + (long)p_Var25) +
                   (long)(iVar40 * 9 * (int)uVar33) * 4;
          lVar36 = uVar42 * 0x24;
          Mat::channel((Mat *)&pd,pMVar44,(int)uVar33);
          iVar43 = pd.params[0].v.allocator._4_4_;
          piVar27 = pd.params[0].v.refcount;
          uVar11 = pd.params[0]._0_8_;
          Mat::~Mat((Mat *)&pd);
          fVar1 = *(float *)(lVar36 + 0x18 + lVar37);
          fVar2 = *(float *)(lVar36 + 0x1c + lVar37);
          fVar3 = *(float *)(lVar36 + 0x20 + lVar37);
          fVar4 = *(float *)(lVar36 + 0x10 + lVar37);
          fVar5 = *(float *)(lVar36 + lVar37);
          fVar6 = *(float *)(lVar36 + 4 + lVar37);
          fVar7 = *(float *)(lVar36 + 8 + lVar37);
          fVar8 = *(float *)(lVar36 + 0xc + lVar37);
          fVar9 = *(float *)(lVar36 + 0x14 + lVar37);
          for (lVar37 = 8; lVar37 != 0x38; lVar37 = lVar37 + 0xc) {
            fVar10 = *(float *)((long)&DAT_00163b80 + lVar37);
            fVar46 = (float)*(undefined8 *)(&UNK_00163b78 + lVar37);
            fVar47 = (float)((ulong)*(undefined8 *)(&UNK_00163b78 + lVar37) >> 0x20);
            *(ulong *)((long)&uStack_940 + lVar37) =
                 CONCAT44(fVar10 * fVar9 + fVar47 * fVar4 + fVar46 * fVar8,
                          fVar10 * fVar7 + fVar46 * fVar5 + fVar47 * fVar6);
            *(float *)((long)&pd.params[0].type + lVar37) =
                 fVar10 * fVar3 + fVar46 * fVar1 + fVar47 * fVar2;
          }
          lVar36 = uVar11 + (long)piVar27 * (long)(iVar43 * (int)uVar42);
          for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
            fVar1 = (float)(&pd.params[0].type)[lVar37 * 3];
            uVar11 = *(undefined8 *)(&pd.params[0].field_1 + lVar37 * 3);
            puVar31 = &DAT_00163b84;
            for (lVar39 = 0; lVar39 != 4; lVar39 = lVar39 + 1) {
              *(float *)(lVar36 + lVar39 * 4) =
                   (float)((ulong)*puVar31 >> 0x20) * (float)((ulong)uVar11 >> 0x20) +
                   *(float *)((long)puVar31 + -4) * fVar1 + (float)*puVar31 * (float)uVar11;
              puVar31 = (undefined8 *)((long)puVar31 + 0xc);
            }
            lVar36 = lVar36 + 0x10;
          }
        }
      }
    }
  }
  p_Var25 = this->_vptr_Convolution_x86[-3];
  if ((&this->field_0x1c8)[(long)p_Var25] == '\0') {
    iVar35 = *(int *)(p_Var25 + 0x2c + (long)&(this->weight_sgemm_data).data) *
             *(int *)(p_Var25 + 0x30 + (long)&(this->weight_sgemm_data).data);
    uVar45 = (long)*(int *)(&this->field_0xb4 + (long)p_Var25) / (long)iVar35;
    iVar40 = *(int *)(p_Var25 + 0x28 + (long)&(this->weight_sgemm_data).data);
    uVar42 = (ulong)iVar40;
    lVar37 = *(long *)(&this->field_0x100 + (long)p_Var25);
    pMVar44 = &this->weight_sgemm_data;
    uVar33 = 0;
    _h = (int)((long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
              (long)iVar40);
    Mat::create(pMVar44,iVar35 * 4,_h,(iVar40 / 4) * -3 + iVar40,4,(Allocator *)0x0);
    iVar28 = _h * iVar35;
    iVar43 = 0;
    if (0 < iVar28) {
      iVar43 = iVar28;
    }
    uVar45 = (ulong)(uint)(iVar40 >> 2);
    if (iVar40 >> 2 < 1) {
      uVar45 = uVar33;
    }
    iVar30 = iVar28 * 4;
    iVar41 = iVar28 * 2;
    iVar40 = iVar28 * 3;
    iVar38 = iVar28;
    uStack_940._4_4_ = _h;
    for (uVar34 = 0; uVar34 != uVar45; uVar34 = uVar34 + 1) {
      Mat::channel((Mat *)&pd,pMVar44,(int)uVar34);
      puVar32 = (undefined4 *)pd.params[0]._0_8_;
      Mat::~Mat((Mat *)&pd);
      for (lVar36 = 0; iVar43 != (int)lVar36; lVar36 = lVar36 + 1) {
        *puVar32 = *(undefined4 *)(lVar37 + (long)(int)uVar33 * 4 + lVar36 * 4);
        puVar32[1] = *(undefined4 *)(lVar37 + (long)iVar38 * 4 + lVar36 * 4);
        puVar32[2] = *(undefined4 *)(lVar37 + (long)iVar41 * 4 + lVar36 * 4);
        puVar32[3] = *(undefined4 *)(lVar37 + (long)iVar40 * 4 + lVar36 * 4);
        puVar32 = puVar32 + 4;
      }
      uVar33 = (ulong)(uint)((int)uVar33 + iVar30);
      iVar38 = iVar38 + iVar30;
      iVar41 = iVar41 + iVar30;
      iVar40 = iVar40 + iVar30;
    }
    iVar40 = iVar35 * uStack_940._4_4_ * ((uint)(uVar42 >> 2) & 0x3fffffff) * 4;
    for (uVar45 = uVar42 & 0xfffffffffffffffc; (long)uVar45 < (long)uVar42; uVar45 = uVar45 + 1) {
      uVar33 = (ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff;
      Mat::channel((Mat *)&pd,pMVar44,(int)((long)uVar33 % 4) + (int)((long)uVar33 / 4));
      uVar11 = pd.params[0]._0_8_;
      Mat::~Mat((Mat *)&pd);
      for (lVar36 = 0; iVar43 != (int)lVar36; lVar36 = lVar36 + 1) {
        *(undefined4 *)(uVar11 + lVar36 * 4) =
             *(undefined4 *)(lVar37 + (long)iVar40 * 4 + lVar36 * 4);
      }
      iVar40 = iVar40 + iVar28;
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    use_winograd3x3 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        int num_input = weight_data_size / 9 / num_output;
        // winograd is slow on small channel count
        if(num_input >= 16 && num_output >= 16)
            use_winograd3x3 = true;
    }           

    if (use_winograd3x3)
    {
        int num_input = weight_data_size / 9 / num_output;

        if (use_int8_inference)
            // conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
        else
            conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
//             conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd43_data, num_input, num_output);
    }

    if (use_int8_inference == false)
    {
        int kernel_size = kernel_w * kernel_h;
        int num_input = weight_data_size / kernel_size / num_output;

        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }       

    return 0;
}